

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::StreamArchive::decode_payload_deflate
          (StreamArchive *this,void *blob,size_t blob_size,Entry *entry,bool concurrent)

{
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  size_t sVar4;
  mz_ulong mVar5;
  size_t local_70;
  mz_ulong zsize;
  uint32_t disk_crc;
  uint8_t *new_zlib_buffer;
  ConditionalLockGuard holder;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> zlib_buffer_holder;
  uint8_t *dst_zlib_buffer;
  bool concurrent_local;
  Entry *entry_local;
  size_t blob_size_local;
  void *blob_local;
  StreamArchive *this_local;
  
  if ((entry->header).uncompressed_size != blob_size) {
    this_local._7_1_ = 0;
    goto LAB_001a2148;
  }
  zlib_buffer_holder._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&holder.enable);
  ConditionalLockGuard::ConditionalLockGuard
            ((ConditionalLockGuard *)&new_zlib_buffer,&this->read_lock,concurrent);
  if (concurrent) {
    zlib_buffer_holder._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         operator_new__((ulong)(entry->header).payload_size);
    std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
    reset<unsigned_char*,void>
              ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&holder.enable,
               (uchar *)zlib_buffer_holder._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
LAB_001a1fed:
    iVar2 = fseek((FILE *)this->file,entry->offset,0);
    if (iVar2 < 0) {
      this_local._7_1_ = 0;
      zsize._4_4_ = 1;
    }
    else {
      sVar4 = fread((void *)zlib_buffer_holder._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,1,
                    (ulong)(entry->header).payload_size,(FILE *)this->file);
      if (sVar4 == (entry->header).payload_size) {
        zsize._4_4_ = 0;
      }
      else {
        this_local._7_1_ = 0;
        zsize._4_4_ = 1;
      }
    }
  }
  else {
    if ((ulong)(entry->header).payload_size <= this->zlib_buffer_size) {
      zlib_buffer_holder._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           this->zlib_buffer;
      goto LAB_001a1fed;
    }
    _disk_crc = (uint8_t *)realloc(this->zlib_buffer,(ulong)(entry->header).payload_size);
    if (_disk_crc == (uint8_t *)0x0) {
      free(this->zlib_buffer);
      this->zlib_buffer = (uint8_t *)0x0;
      this->zlib_buffer_size = 0;
    }
    else {
      this->zlib_buffer = _disk_crc;
      this->zlib_buffer_size = (ulong)(entry->header).payload_size;
    }
    if (this->zlib_buffer != (uint8_t *)0x0) {
      zlib_buffer_holder._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           this->zlib_buffer;
      goto LAB_001a1fed;
    }
    this_local._7_1_ = 0;
    zsize._4_4_ = 1;
  }
  ConditionalLockGuard::~ConditionalLockGuard((ConditionalLockGuard *)&new_zlib_buffer);
  if (zsize._4_4_ == 0) {
    if ((entry->header).crc != 0) {
      mVar5 = mz_crc32(0,(mz_uint8 *)
                         zlib_buffer_holder._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                       (ulong)(entry->header).payload_size);
      zsize._0_4_ = (uint32_t)mVar5;
      if ((uint32_t)zsize != (entry->header).crc) {
        LVar3 = get_thread_log_level();
        if (((int)LVar3 < 3) &&
           (bVar1 = Internal::log_thread_callback(LOG_ERROR,"CRC mismatch!\n"), !bVar1)) {
          fprintf(_stderr,"Fossilize ERROR: CRC mismatch!\n");
        }
        this_local._7_1_ = 0;
        zsize._4_4_ = 1;
        goto LAB_001a213f;
      }
    }
    local_70 = blob_size;
    iVar2 = mz_uncompress((uchar *)blob,&local_70,
                          (uchar *)zlib_buffer_holder._M_t.
                                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                          (ulong)(entry->header).payload_size);
    if (iVar2 == 0) {
      if (local_70 == blob_size) {
        this_local._7_1_ = 1;
        zsize._4_4_ = 1;
      }
      else {
        this_local._7_1_ = 0;
        zsize._4_4_ = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
      zsize._4_4_ = 1;
    }
  }
LAB_001a213f:
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&holder.enable);
LAB_001a2148:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool decode_payload_deflate(void *blob, size_t blob_size, const Entry &entry, bool concurrent)
	{
		if (entry.header.uncompressed_size != blob_size)
			return false;

		uint8_t *dst_zlib_buffer = nullptr;
		std::unique_ptr<uint8_t[]> zlib_buffer_holder;

		{
			ConditionalLockGuard holder(read_lock, concurrent);
			if (concurrent)
			{
				dst_zlib_buffer = new uint8_t[entry.header.payload_size];
				zlib_buffer_holder.reset(dst_zlib_buffer);
			}
			else if (zlib_buffer_size < entry.header.payload_size)
			{
				auto *new_zlib_buffer = static_cast<uint8_t *>(realloc(zlib_buffer, entry.header.payload_size));
				if (new_zlib_buffer)
				{
					zlib_buffer = new_zlib_buffer;
					zlib_buffer_size = entry.header.payload_size;
				}
				else
				{
					free(zlib_buffer);
					zlib_buffer = nullptr;
					zlib_buffer_size = 0;
				}

				if (!zlib_buffer)
					return false;

				dst_zlib_buffer = zlib_buffer;
			}
			else
				dst_zlib_buffer = zlib_buffer;

			if (fseek(file, entry.offset, SEEK_SET) < 0)
				return false;
			if (fread(dst_zlib_buffer, 1, entry.header.payload_size, file) != entry.header.payload_size)
				return false;
		}

		if (entry.header.crc != 0) // Verify checksum.
		{
			auto disk_crc = uint32_t(mz_crc32(MZ_CRC32_INIT, dst_zlib_buffer, entry.header.payload_size));
			if (disk_crc != entry.header.crc)
			{
				LOGE_LEVEL("CRC mismatch!\n");
				return false;
			}
		}

		mz_ulong zsize = blob_size;
		if (mz_uncompress(static_cast<unsigned char *>(blob), &zsize, dst_zlib_buffer, entry.header.payload_size) != MZ_OK)
			return false;
		if (zsize != blob_size)
			return false;

		return true;
	}